

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> __thiscall
kj::anon_unknown_0::LowLevelAsyncIoProviderImpl::wrapConnectingSocketFd
          (LowLevelAsyncIoProviderImpl *this,int fd,sockaddr *addr,uint addrlen,uint flags)

{
  long lVar1;
  AsyncStreamFd *pAVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  undefined4 in_register_0000000c;
  int __fd;
  undefined4 in_register_00000034;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1519:27)>
  *location;
  Promise<void> connected;
  String address;
  Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> result;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_d8;
  uint flags_local;
  int fd_local;
  FixVoid<kj::Own<kj::AsyncIoStream>_> local_c8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_b8;
  Fault f;
  anon_union_128_5_6547fd28_for_addr local_a8;
  
  __fd = (int)addr;
  f.exception._0_4_ = 3;
  fd_local = __fd;
  heap<kj::(anonymous_namespace)::AsyncStreamFd,kj::UnixEventPort&,int&,unsigned_int&,kj::UnixEventPort::FdObserver::Flags>
            ((kj *)&result,*(UnixEventPort **)(CONCAT44(in_register_00000034,fd) + 8),&fd_local,
             &flags_local,(Flags *)&f);
  do {
    iVar3 = ::connect(__fd,(sockaddr *)CONCAT44(in_register_0000000c,addrlen),flags);
    if (-1 < iVar3) goto LAB_0038ac88;
    piVar4 = __errno_location();
    iVar3 = *piVar4;
  } while (iVar3 == 4);
  if (iVar3 == 0x73) {
LAB_0038ac88:
    pAVar2 = result.ptr;
    f.exception._4_4_ = 4;
    f.exception._0_4_ = ((result.ptr)->super_OwnedFileDescriptor).fd;
    do {
      iVar3 = poll((pollfd *)&f,1,0);
      if (-1 < iVar3) {
        if (iVar3 != 0) goto LAB_0038ad02;
        UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)&connected);
        goto LAB_0038ad13;
      }
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&address,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x21e,iVar3,"pollResult = poll(&pollfd, 1, 0)","");
      kj::_::Debug::Fault::fatal((Fault *)&address);
    }
LAB_0038ad02:
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)&connected);
LAB_0038ad13:
    f.exception._0_4_ = __fd;
    local_a8._0_8_ = result.disposer;
    result.ptr = (AsyncStreamFd *)0x0;
    local_a8.inet4.sin_zero = (uchar  [8])pAVar2;
    address.content.ptr =
         (char *)kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1519:27)>
                 ::anon_class_24_2_651ff19b_for_func::operator();
    lVar1 = *(long *)((long)connected.super_PromiseBase.node.ptr + 8);
    if (lVar1 == 0 || (ulong)((long)connected.super_PromiseBase.node.ptr - lVar1) < 0x38) {
      pvVar5 = operator_new(0x400);
      location = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1519:27)>
                  *)((long)pvVar5 + 0x3c8);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl::wrapConnectingSocketFd(int,sockaddr_const*,unsigned_int,unsigned_int)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl::wrapConnectingSocketFd(int,sockaddr_const*,unsigned_int,unsigned_int)::_lambda()_1_,void*&>
                (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&connected,
                 (anon_class_24_2_651ff19b_for_func *)&f,(void **)&address);
      *(void **)((long)pvVar5 + 0x3d0) = pvVar5;
    }
    else {
      *(undefined8 *)((long)connected.super_PromiseBase.node.ptr + 8) = 0;
      location = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1519:27)>
                  *)((long)connected.super_PromiseBase.node.ptr + -0x38);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl::wrapConnectingSocketFd(int,sockaddr_const*,unsigned_int,unsigned_int)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl::wrapConnectingSocketFd(int,sockaddr_const*,unsigned_int,unsigned_int)::_lambda()_1_,void*&>
                (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&connected,
                 (anon_class_24_2_651ff19b_for_func *)&f,(void **)&address);
      *(long *)((long)connected.super_PromiseBase.node.ptr + -0x30) = lVar1;
    }
    local_d8.ptr = (PromiseNode *)0x0;
    (this->super_LowLevelAsyncIoProvider)._vptr_LowLevelAsyncIoProvider = (_func_int **)location;
    local_b8.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_b8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d8);
    Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> *)&local_a8.generic);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&connected);
  }
  else {
    SocketAddress::SocketAddress
              ((SocketAddress *)&f,(sockaddr *)CONCAT44(in_register_0000000c,addrlen),flags);
    SocketAddress::toString(&address,(SocketAddress *)&f);
    kj::_::Debug::Fault::Fault<int,kj::String&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x5e5,iVar3,"connect()","address",&address);
    kj::_::Debug::Fault::~Fault(&f);
    local_c8.disposer = (Disposer *)0x0;
    local_c8.ptr = (AsyncIoStream *)0x0;
    Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::Promise
              ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)this,&local_c8);
    Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_c8);
    Array<char>::~Array(&address.content);
  }
  Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t>::~Own(&result);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<AsyncIoStream>> wrapConnectingSocketFd(
      int fd, const struct sockaddr* addr, uint addrlen, uint flags = 0) override {
    // It's important that we construct the AsyncStreamFd first, so that `flags` are honored,
    // especially setting nonblocking mode and taking ownership.
    auto result = heap<AsyncStreamFd>(eventPort, fd, flags,
                                      UnixEventPort::FdObserver::OBSERVE_READ_WRITE);

    // Unfortunately connect() doesn't fit the mold of KJ_NONBLOCKING_SYSCALL, since it indicates
    // non-blocking using EINPROGRESS.
    for (;;) {
      if (::connect(fd, addr, addrlen) < 0) {
        int error = errno;
        if (error == EINPROGRESS) {
          // Fine.
          break;
        } else if (error != EINTR) {
          auto address = SocketAddress(addr, addrlen).toString();
          KJ_FAIL_SYSCALL("connect()", error, address) { break; }
          return Own<AsyncIoStream>();
        }
      } else {
        // no error
        break;
      }
    }

    auto connected = result->waitConnected();
    return connected.then([fd,stream=kj::mv(result)]() mutable -> Own<AsyncIoStream> {
      int err;
      socklen_t errlen = sizeof(err);
      KJ_SYSCALL(getsockopt(fd, SOL_SOCKET, SO_ERROR, &err, &errlen));
      if (err != 0) {
        KJ_FAIL_SYSCALL("connect()", err) { break; }
      }
      return kj::mv(stream);
    });
  }